

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  bool bVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> *__x;
  size_type sVar3;
  reference pvVar4;
  int local_15c;
  undefined1 local_158 [4];
  int i;
  vector<int,_std::allocator<int>_> ans;
  undefined1 local_138 [4];
  int iterations;
  undefined1 local_118 [8];
  Population population;
  undefined1 local_a0 [8];
  Diophantine diophantine;
  int result;
  allocator<int> local_69;
  int local_68 [12];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> coeffs;
  
  coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_68[4] = 5;
  local_68[5] = 6;
  local_68[6] = 7;
  local_68[7] = 8;
  local_68[0] = 1;
  local_68[1] = 2;
  local_68[2] = 3;
  local_68[3] = 4;
  local_68[8] = 9;
  local_38 = local_68;
  local_30 = 9;
  std::allocator<int>::allocator(&local_69);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_69);
  std::allocator<int>::~allocator(&local_69);
  diophantine.result = 10000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &population.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)local_28);
  Diophantine::Diophantine
            ((Diophantine *)local_a0,
             (vector<int,_std::allocator<int>_> *)
             &population.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,diophantine.result);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &population.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Diophantine::Diophantine((Diophantine *)local_138,(Diophantine *)local_a0);
  Population::Population((Population *)local_118,(Diophantine *)local_138,0.01,0x32);
  Diophantine::~Diophantine((Diophantine *)local_138);
  ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while (bVar1 = Population::AnswerReady((Population *)local_118),
        !bVar1 && ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage._4_4_ < 50000) {
    ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
    Population::evolve((Population *)local_118);
    if (ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ % 100 == 0) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_);
      std::operator<<(poVar2,"\n");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"population size = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"mutation rate = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.01);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"iterations = ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,ans.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"answer is ready = ");
  bVar1 = Population::AnswerReady((Population *)local_118);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,"\n");
  __x = Population::GetAnswer((Population *)local_118);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_158,__x)
  ;
  for (local_15c = 0;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_158),
      (ulong)(long)local_15c < sVar3; local_15c = local_15c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_158,(long)local_15c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
    poVar2 = std::operator<<(poVar2,"*");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)local_15c);
    std::ostream::operator<<(poVar2,*pvVar4);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_158);
    if ((long)(local_15c + 1) != sVar3) {
      std::operator<<((ostream *)&std::cout," + ");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout," = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,diophantine.result);
  std::operator<<(poVar2,"\n");
  coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_158);
  Population::~Population((Population *)local_118);
  Diophantine::~Diophantine((Diophantine *)local_a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<int> coeffs = {1, 2, 3, 4, 5, 6, 7, 8, 9};
    int result = 10000;
    Diophantine diophantine(coeffs, result);
    Population population(diophantine, mutationRate, populationSize);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < 50000) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << "\n";
        }
    }

    cout << "population size = " << populationSize << "\n";
    cout << "mutation rate = " << mutationRate << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n";

    auto ans = population.GetAnswer();

    for (int i = 0; i < ans.size(); ++i) {
        cout << ans[i]  << "*"  << coeffs[i];
        if (i + 1 != ans.size()) {
            cout << " + ";
        }
    }
    cout << " = " << result << "\n";

    return 0;
}